

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

bool Js::RegexHelper::GetFlags
               (ScriptContext *scriptContext,char16 *str,CharCount strLen,RegexFlags *flags)

{
  ulong uVar1;
  RegexFlags RVar2;
  RegexFlags RVar3;
  RegexFlags RVar4;
  
  RVar2 = *flags;
  for (uVar1 = 0; strLen != uVar1; uVar1 = uVar1 + 1) {
    switch((ushort)str[uVar1] - 0x67 >> 1 | (uint)(((ushort)str[uVar1] - 0x67 & 1) != 0) << 0x1f) {
    case 0:
      RVar3 = GlobalRegexFlag;
      RVar4 = RVar2 & GlobalRegexFlag;
      goto joined_r0x00bdc7f8;
    case 1:
      RVar3 = IgnoreCaseRegexFlag;
      RVar4 = RVar2 & IgnoreCaseRegexFlag;
joined_r0x00bdc7f8:
      if (RVar4 == NoRegexFlags) goto LAB_00bdc816;
    default:
      goto switchD_00bdc7a0_caseD_2;
    case 3:
      RVar3 = MultilineRegexFlag;
      RVar4 = RVar2 & MultilineRegexFlag;
      break;
    case 6:
      if (((scriptContext->config).threadConfig)->m_ES2018RegExDotAll != true)
      goto switchD_00bdc7a0_caseD_2;
      RVar3 = DotAllRegexFlag;
      RVar4 = RVar2 & DotAllRegexFlag;
      break;
    case 7:
      if (((scriptContext->config).threadConfig)->m_ES6Unicode != true)
      goto switchD_00bdc7a0_caseD_2;
      RVar3 = UnicodeRegexFlag;
      RVar4 = RVar2 & UnicodeRegexFlag;
      break;
    case 9:
      if (((scriptContext->config).threadConfig)->m_ES6RegExSticky != true)
      goto switchD_00bdc7a0_caseD_2;
      RVar3 = StickyRegexFlag;
      RVar4 = RVar2 & StickyRegexFlag;
    }
    if (RVar4 != NoRegexFlags) break;
LAB_00bdc816:
    RVar2 = RVar2 | RVar3;
    *flags = RVar2;
  }
switchD_00bdc7a0_caseD_2:
  return strLen <= uVar1;
}

Assistant:

bool RegexHelper::GetFlags(Js::ScriptContext* scriptContext, __in_ecount(strLen) const char16* str, CharCount strLen, UnifiedRegex::RegexFlags &flags)
    {
        for (CharCount i = 0; i < strLen; i++)
        {
            switch (str[i])
            {
            case 'i':
                if ((flags & UnifiedRegex::IgnoreCaseRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & UnifiedRegex::GlobalRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & UnifiedRegex::MultilineRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & UnifiedRegex::DotAllRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::DotAllRegexFlag);
                    break;
                }
                return false;
            case 'u':
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if((flags & UnifiedRegex::UnicodeRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::UnicodeRegexFlag);
                    break;
                }
                return false;
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & UnifiedRegex::StickyRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::StickyRegexFlag);
                    break;
                }
                return false;
            default:
                return false;
            }
        }

        return true;
    }